

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddMisc.c
# Opt level: O3

int cuddZddDagInt(DdNode *n,st__table *tab)

{
  int iVar1;
  int iVar2;
  
  if (n == (DdNode *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      iVar1 = st__lookup(tab,(char *)n,(char **)0x0);
      if (iVar1 == 1) {
        return iVar2;
      }
      if (*(int *)((ulong)n & 0xfffffffffffffffe) == 0x7fffffff) {
        return iVar2;
      }
      st__insert(tab,(char *)n,(char *)0x0);
      iVar1 = cuddZddDagInt((n->type).kids.T,tab);
      n = (n->type).kids.E;
      iVar2 = iVar2 + iVar1 + 1;
    } while (n != (DdNode *)0x0);
  }
  return iVar2;
}

Assistant:

static int
cuddZddDagInt(
  DdNode * n,
  st__table * tab)
{
    if (n == NIL(DdNode))
        return(0);

    if ( st__is_member(tab, (char *)n) == 1)
        return(0);

    if (Cudd_IsConstant(n))
        return(0);

    (void) st__insert(tab, (char *)n, NIL(char));
    return(1 + cuddZddDagInt(cuddT(n), tab) +
        cuddZddDagInt(cuddE(n), tab));

}